

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O0

int __thiscall
MatroskaDemuxer::matroska_parse_blockgroup(MatroskaDemuxer *this,int64_t cluster_time)

{
  int64_t iVar1;
  size_type sVar2;
  reference ppAVar3;
  long local_68;
  int64_t num_1;
  int64_t num;
  int64_t pos;
  uint8_t *puStack_48;
  int size;
  uint8_t *data;
  int64_t duration;
  size_t last_num_packets;
  int is_keyframe;
  int is_bframe;
  uint32_t id;
  int res;
  int64_t cluster_time_local;
  MatroskaDemuxer *this_local;
  
  is_bframe = 0;
  last_num_packets._4_4_ = 0;
  last_num_packets._0_4_ = 1;
  _id = cluster_time;
  cluster_time_local = (int64_t)this;
  duration = std::queue<AVPacket_*,_std::deque<AVPacket_*,_std::allocator<AVPacket_*>_>_>::size
                       (&this->packets);
  data = (uint8_t *)0x8000000000000000;
  puStack_48 = (uint8_t *)0x0;
  pos._4_4_ = 0;
  num = 0;
  do {
    if (is_bframe != 0) goto LAB_002c6e2d;
    is_keyframe = ebml_peek_id(this,&this->level_up);
    iVar1 = duration;
    if (is_keyframe == 0) {
      is_bframe = -1;
      goto LAB_002c6e2d;
    }
    if (this->level_up != 0) {
      this->level_up = this->level_up + -1;
      goto LAB_002c6e2d;
    }
    if (is_keyframe == 0x9b) {
      is_bframe = ebml_read_uint(this,(uint32_t *)&is_keyframe,&num_1);
      if (-1 < is_bframe) {
        data = (uint8_t *)num_1;
      }
    }
    else if (is_keyframe == 0xa1) {
      num = (this->super_IOContextDemuxer).m_processedBytes;
      is_bframe = ebml_read_binary(this,(uint32_t *)&is_keyframe,&stack0xffffffffffffffb8,
                                   (int *)((long)&pos + 4));
    }
    else if ((is_keyframe == 0xbf) || (is_keyframe == 0xec)) {
      is_bframe = ebml_read_skip(this);
    }
    else if (is_keyframe == 0xfb) {
      last_num_packets._0_4_ = 0;
      sVar2 = std::queue<AVPacket_*,_std::deque<AVPacket_*,_std::allocator<AVPacket_*>_>_>::size
                        (&this->packets);
      if (iVar1 != sVar2) {
        ppAVar3 = std::queue<AVPacket_*,_std::deque<AVPacket_*,_std::allocator<AVPacket_*>_>_>::back
                            (&this->packets);
        (*ppAVar3)->flags = 0;
      }
      is_bframe = ebml_read_sint(this,(uint32_t *)&is_keyframe,&local_68);
      if ((-1 < is_bframe) && (0 < local_68)) {
        last_num_packets._4_4_ = 1;
      }
    }
    else {
      is_bframe = ebml_read_skip(this);
    }
  } while (this->level_up == 0);
  this->level_up = this->level_up + -1;
LAB_002c6e2d:
  if (is_bframe == 0) {
    if (puStack_48 != (uint8_t *)0x0) {
      is_bframe = matroska_parse_block
                            (this,puStack_48,pos._4_4_,num,_id,(int64_t)data,(int)last_num_packets,
                             last_num_packets._4_4_);
    }
    this_local._4_4_ = is_bframe;
  }
  else {
    this_local._4_4_ = is_bframe;
  }
  return this_local._4_4_;
}

Assistant:

int MatroskaDemuxer::matroska_parse_blockgroup(const int64_t cluster_time)
{
    int res = 0;
    uint32_t id;
    int is_bframe = 0;
    int is_keyframe = PKT_FLAG_KEY;
    const size_t last_num_packets = packets.size();
    int64_t duration = AV_NOPTS_VALUE;
    uint8_t *data = nullptr;
    int size = 0;
    int64_t pos = 0;

    while (res == 0)
    {
        if ((id = ebml_peek_id(&level_up)) == 0)
        {
            res = -BufferedReader::DATA_EOF;
            break;
        }
        if (level_up)
        {
            level_up--;
            break;
        }

        switch (id)
        {
        /* one block inside the group. Note, block parsing is one
         * of the harder things, so this code is a bit complicated.
         * See http://www.matroska.org/ for documentation. */
        case MATROSKA_ID_BLOCK:
        {
            pos = m_processedBytes;
            res = ebml_read_binary(&id, &data, &size);
            break;
        }

        case MATROSKA_ID_BLOCKDURATION:
        {
            int64_t num;
            if ((res = ebml_read_uint(&id, &num)) < 0)
                break;
            duration = num;
            break;
        }

        case MATROSKA_ID_BLOCKREFERENCE:
        {
            int64_t num;
            /* We've found a reference, so not even the first frame in
             * the lace is a key frame. */
            is_keyframe = 0;
            if (last_num_packets != packets.size())
                packets.back()->flags = 0;
            if ((res = ebml_read_sint(&id, &num)) < 0)
                break;
            if (num > 0)
                is_bframe = 1;
            break;
        }
        case EBML_ID_VOID:
        case EBML_ID_CRC32:
            res = ebml_read_skip();
            break;
        default:
            res = ebml_read_skip();
            LTRACE(LT_INFO, 0, "Unknown entry " << id << " in blockgroup data");
        }

        if (level_up)
        {
            level_up--;
            break;
        }
    }

    if (res)
        return res;

    if (data != nullptr)
        res = matroska_parse_block(data, size, pos, cluster_time, duration, is_keyframe, is_bframe);

    return res;
}